

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O1

string * __thiscall
relive::ChatMessage::nick_abi_cxx11_(string *__return_storage_ptr__,ChatMessage *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  
  pbVar2 = (this->_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pbVar2 == (this->_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) || (pbVar2->_M_string_length == 0)) ||
     (this->_type == eUnknown)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + pbVar2->_M_string_length);
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = __return_storage_ptr__->_M_string_length;
    if (pcVar3[sVar4 - 1] == '@') {
      if (sVar4 == 0) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar5);
      }
      __return_storage_ptr__->_M_string_length = sVar4 - 1;
      pcVar3[sVar4 - 1] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nick() const {
        if(!hasNick()) {
            return std::string();
        }
        auto result = _strings.front();
        if(result[result.length()-1] == '@') {
            result.erase(result.length()-1);
        }
        return result;
    }